

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

tuple<slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck>
slang::ast::getConditionAndCheck(CaseStatementSyntax *syntax)

{
  _Tuple_impl<1UL,_slang::ast::CaseStatementCheck> _Var1;
  _Tuple_impl<0UL,_slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck> _Var2;
  logic_error *plVar3;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  short in_DX;
  ulong in_RSI;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (2 < (ushort)(in_DX - 0x74U)) {
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
               ,"");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
      local_b0.field_2._M_allocated_capacity = *psVar5;
      local_b0.field_2._8_8_ = plVar4[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar5;
    }
    local_b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x3f0);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar4;
    plVar6 = plVar4 + 2;
    if (local_90 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar4[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar6;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar4;
    plVar6 = plVar4 + 2;
    if (local_f0 == plVar6) {
      local_e0 = *plVar6;
      lStack_d8 = plVar4[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar6;
    }
    local_e8 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::logic_error::logic_error(plVar3,(string *)&local_f0);
    __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  _Var2 = (_Tuple_impl<0UL,_slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck>)
          (in_RSI & 0xffff);
  _Var1 = _Var2.super__Tuple_impl<1UL,_slang::ast::CaseStatementCheck>.
          super__Head_base<1UL,_slang::ast::CaseStatementCheck,_false>._M_head_impl;
  if ((uint)_Var1.super__Head_base<1UL,_slang::ast::CaseStatementCheck,_false>._M_head_impl < 0x13c)
  {
    if (_Var1.super__Head_base<1UL,_slang::ast::CaseStatementCheck,_false>._M_head_impl != None) {
      if (_Var1.super__Head_base<1UL,_slang::ast::CaseStatementCheck,_false>._M_head_impl != 0xef) {
LAB_00292878:
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
                   ,"");
        plVar4 = (long *)std::__cxx11::string::append((char *)local_d0);
        local_b0._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
          local_b0.field_2._M_allocated_capacity = *psVar5;
          local_b0.field_2._8_8_ = plVar4[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar5;
        }
        local_b0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::to_string(&local_70,0x402);
        std::operator+(&local_50,&local_b0,&local_70);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_90 = (long *)*plVar4;
        plVar6 = plVar4 + 2;
        if (local_90 == plVar6) {
          local_80 = *plVar6;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar6;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_f0 = (long *)*plVar4;
        plVar6 = plVar4 + 2;
        if (local_f0 == plVar6) {
          local_e0 = *plVar6;
          lStack_d8 = plVar4[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar6;
        }
        local_e8 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::logic_error::logic_error(plVar3,(string *)&local_f0);
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      _Var2.super__Tuple_impl<1UL,_slang::ast::CaseStatementCheck>.
      super__Head_base<1UL,_slang::ast::CaseStatementCheck,_false>._M_head_impl =
           (_Head_base<1UL,_slang::ast::CaseStatementCheck,_false>)0x3;
      _Var2.super__Head_base<0UL,_slang::ast::CaseStatementCondition,_false>._M_head_impl = Normal;
    }
  }
  else if (_Var1.super__Head_base<1UL,_slang::ast::CaseStatementCheck,_false>._M_head_impl == 0x13d)
  {
    _Var2.super__Tuple_impl<1UL,_slang::ast::CaseStatementCheck>.
    super__Head_base<1UL,_slang::ast::CaseStatementCheck,_false>._M_head_impl =
         (_Head_base<1UL,_slang::ast::CaseStatementCheck,_false>)0x2;
    _Var2.super__Head_base<0UL,_slang::ast::CaseStatementCondition,_false>._M_head_impl = Normal;
  }
  else {
    if (_Var1.super__Head_base<1UL,_slang::ast::CaseStatementCheck,_false>._M_head_impl != 0x13c)
    goto LAB_00292878;
    _Var2.super__Tuple_impl<1UL,_slang::ast::CaseStatementCheck>.
    super__Head_base<1UL,_slang::ast::CaseStatementCheck,_false>._M_head_impl =
         (_Head_base<1UL,_slang::ast::CaseStatementCheck,_false>)0x1;
    _Var2.super__Head_base<0UL,_slang::ast::CaseStatementCondition,_false>._M_head_impl = Normal;
  }
  *(_Head_base<1UL,_slang::ast::CaseStatementCheck,_false> *)
   &(syntax->super_StatementSyntax).super_SyntaxNode.parent =
       _Var2.super__Tuple_impl<1UL,_slang::ast::CaseStatementCheck>.
       super__Head_base<1UL,_slang::ast::CaseStatementCheck,_false>._M_head_impl.
       super__Head_base<1UL,_slang::ast::CaseStatementCheck,_false>;
  *(uint *)((long)&(syntax->super_StatementSyntax).super_SyntaxNode.parent + 4) =
       (uint)(ushort)(in_DX - 0x74U);
  return (tuple<slang::ast::CaseStatementCondition,_slang::ast::CaseStatementCheck>)_Var2;
}

Assistant:

static std::tuple<CaseStatementCondition, CaseStatementCheck> getConditionAndCheck(
    const CaseStatementSyntax& syntax) {

    CaseStatementCondition condition;
    switch (syntax.caseKeyword.kind) {
        case TokenKind::CaseKeyword:
            condition = CaseStatementCondition::Normal;
            break;
        case TokenKind::CaseXKeyword:
            condition = CaseStatementCondition::WildcardXOrZ;
            break;
        case TokenKind::CaseZKeyword:
            condition = CaseStatementCondition::WildcardJustZ;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    CaseStatementCheck check;
    switch (syntax.uniqueOrPriority.kind) {
        case TokenKind::Unknown:
            check = CaseStatementCheck::None;
            break;
        case TokenKind::UniqueKeyword:
            check = CaseStatementCheck::Unique;
            break;
        case TokenKind::Unique0Keyword:
            check = CaseStatementCheck::Unique0;
            break;
        case TokenKind::PriorityKeyword:
            check = CaseStatementCheck::Priority;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    return {condition, check};
}